

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceBindingBase.hpp
# Opt level: O2

IShaderResourceVariable * __thiscall
Diligent::ShaderResourceBindingBase<Diligent::EngineGLImplTraits>::GetVariableByIndex
          (ShaderResourceBindingBase<Diligent::EngineGLImplTraits> *this,SHADER_TYPE ShaderType,
          Uint32 Index)

{
  PIPELINE_TYPE PipelineType;
  char cVar1;
  SHADER_TYPE SVar2;
  bool bVar3;
  Int32 IVar4;
  uint uVar5;
  IShaderResourceVariable *pIVar6;
  undefined4 uStack_58;
  Uint32 Index_local;
  string _msg;
  char *local_30;
  Char *local_28;
  
  PipelineType = (((this->m_pPRS).m_pObject)->
                 super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>).m_PipelineType;
  Index_local = Index;
  bVar3 = IsConsistentShaderType(ShaderType,PipelineType);
  if (bVar3) {
    IVar4 = GetShaderTypePipelineIndex(ShaderType,PipelineType);
    cVar1 = (this->m_ActiveShaderStageIndex)._M_elems[IVar4];
    if (-1 < cVar1) {
      SVar2 = (((this->m_pPRS).m_pObject)->
              super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>).m_ShaderStages;
      uVar5 = SVar2 - (SVar2 >> 1 & 0x55555555);
      uVar5 = (uVar5 >> 2 & 0x33333333) + (uVar5 & 0x33333333);
      uVar5 = (uVar5 >> 4) + uVar5 & 0xf0f0f0f;
      if (uVar5 * 0x1010101 >> 0x18 <= (uint)(int)cVar1) {
        FormatString<char[26],char[46]>
                  (&_msg,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"static_cast<Uint32>(MgrInd) < GetNumShaders()",
                   (char (*) [46])(ulong)uVar5);
        DebugAssertionFailed
                  (_msg._M_dataplus._M_p,"GetVariableByIndex",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceBindingBase.hpp"
                   ,0xeb);
        std::__cxx11::string::~string((string *)&_msg);
      }
      pIVar6 = ShaderVariableManagerGL::GetVariable(this->m_pShaderVarMgrs + (uint)(int)cVar1,Index)
      ;
      return pIVar6;
    }
  }
  else {
    local_28 = GetShaderTypeLiteralName(ShaderType);
    local_30 = GetPipelineTypeString(PipelineType);
    FormatString<char[49],unsigned_int,char[18],char_const*,char[30],char_const*,char[31],char_const*,char[3]>
              (&_msg,(Diligent *)"Unable to get mutable/dynamic variable at index ",
               (char (*) [49])&Index_local,(uint *)0x2c219b,(char (*) [18])&local_28,
               (char **)" as the stage is invalid for ",(char (*) [30])&local_30,(char **)0x2e7628,
               (char (*) [31])
               &(((this->m_pPRS).m_pObject)->
                super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>).
                super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineResourceSignatureDesc>
                .m_Desc,(char **)"\'.",(char (*) [3])CONCAT44(Index_local,uStack_58));
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(1,_msg._M_dataplus._M_p,0,0,0);
    }
    std::__cxx11::string::~string((string *)&_msg);
  }
  return (IShaderResourceVariable *)0x0;
}

Assistant:

GetVariableByIndex(SHADER_TYPE ShaderType, Uint32 Index) override final
    {
        const PIPELINE_TYPE PipelineType = GetPipelineType();
        if (!IsConsistentShaderType(ShaderType, PipelineType))
        {
            LOG_WARNING_MESSAGE("Unable to get mutable/dynamic variable at index ", Index, " in shader stage ", GetShaderTypeLiteralName(ShaderType),
                                " as the stage is invalid for ", GetPipelineTypeString(PipelineType), " pipeline resource signature '", m_pPRS->GetDesc().Name, "'.");
            return nullptr;
        }

        const Int32 ShaderInd = GetShaderTypePipelineIndex(ShaderType, PipelineType);
        const int   MgrInd    = m_ActiveShaderStageIndex[ShaderInd];
        if (MgrInd < 0)
            return nullptr;

        VERIFY_EXPR(static_cast<Uint32>(MgrInd) < GetNumShaders());
        return m_pShaderVarMgrs[MgrInd].GetVariable(Index);
    }